

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_if::translate
          (method_if *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *pdVar4;
  iterator bfalse;
  statement_if *this_00;
  bool *pbVar5;
  statement_block *psVar6;
  statement_base **ptr_2;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  bool now_place;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_false;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_true;
  token_base *ptr;
  tree_type<cs::token_base_*> *tree;
  statement_base **ptr_1;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  bool have_else;
  _Self *in_stack_fffffffffffffa18;
  compiler_type *in_stack_fffffffffffffa20;
  _Self *in_stack_fffffffffffffa28;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffa30;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_01;
  token_base *in_stack_fffffffffffffa58;
  token_base *ptr_00;
  token_base *in_stack_fffffffffffffa60;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffa68;
  statement_block *in_stack_fffffffffffffa70;
  token_base *in_stack_fffffffffffffa78;
  allocator_type *in_stack_fffffffffffffa88;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffa90;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffa98;
  statement_ifelse *in_stack_fffffffffffffaa0;
  allocator *paVar7;
  element_type *in_stack_fffffffffffffad8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffae0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_4b8;
  undefined1 local_451;
  undefined1 local_391;
  token_base local_390 [6];
  undefined4 local_330;
  undefined1 local_329;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_328;
  reference local_2c8;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_2a0;
  undefined1 *local_280;
  byte local_271;
  tree_node *local_1d0;
  element_type *local_1c8;
  tree_type<cs::token_base_*> *local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  reference local_190;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_168;
  undefined1 *local_148;
  undefined1 local_78 [87];
  byte local_21;
  statement_block *local_8;
  
  local_21 = 0;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x557f54);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x557f61);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x557f69);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffa18);
  std::operator+(in_stack_fffffffffffffa28,(difference_type)in_stack_fffffffffffffa20);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffa18);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x557fe2
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88);
  compiler_type::translate
            (in_stack_fffffffffffffa20,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffa18,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x558026);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffa70);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x558042
            );
  local_148 = local_78;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffa18);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffa18);
  do {
    bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    if (!bVar1) {
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)in_stack_fffffffffffffa30);
      pdVar4 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                         ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                          in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
      local_1c0 = token_expr::get_tree
                            ((token_expr *)
                             (pdVar4->
                             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
                             )._M_impl.super__Deque_impl_data._M_map);
      bfalse = tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffa18);
      local_1d0 = bfalse.mData;
      this_00 = (statement_if *)
                tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffa60);
      local_1c8 = (element_type *)(this_00->super_statement_base)._vptr_statement_base;
      if ((local_21 & 1) == 0) {
        if ((local_1c8 == (element_type *)0x0) ||
           (iVar2 = (*(code *)(((local_1c8->compiler).
                                super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->constant_pool).
                              super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)(), iVar2 != 7)) {
          psVar6 = (statement_block *)
                   statement_base::operator_new((size_t)in_stack_fffffffffffffa20);
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffa20,
                     (tree_type<cs::token_base_*> *)in_stack_fffffffffffffa18);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffae0._M_pi,
                     (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffad8);
          std::shared_ptr<cs::context_type>::shared_ptr
                    ((shared_ptr<cs::context_type> *)&stack0xfffffffffffffad8,
                     (shared_ptr<cs::context_type> *)in_stack_fffffffffffffa18);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffa30);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                    (in_stack_fffffffffffffa30);
          statement_if::statement_if
                    (this_00,(tree_type<cs::token_base_*> *)in_stack_fffffffffffffa78,
                     (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffa70,(context_t *)in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa60);
          local_8 = psVar6;
          std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x558aba);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffa70);
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x558ad4);
          local_330 = 1;
        }
        else {
          token_value::get_value((token_value *)local_1c8);
          pbVar5 = cs_impl::any::const_val<bool>((any *)in_stack_fffffffffffffaa0);
          if ((*pbVar5 & 1U) == 0) {
            local_8 = (statement_block *)0x0;
            local_330 = 1;
          }
          else {
            psVar6 = (statement_block *)
                     statement_base::operator_new((size_t)in_stack_fffffffffffffa20);
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffae0._M_pi,
                       (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffad8);
            this_01 = &local_4b8;
            std::shared_ptr<cs::context_type>::shared_ptr
                      ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffa20,
                       (shared_ptr<cs::context_type> *)in_stack_fffffffffffffa18);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)this_01);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_01);
            statement_block::statement_block
                      (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                       (context_t *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
            local_8 = psVar6;
            std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x558966)
            ;
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffa70);
            local_330 = 1;
          }
        }
      }
      else {
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5582c1);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5582d0);
        local_271 = 1;
        local_280 = local_78;
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                   in_stack_fffffffffffffa18);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                   in_stack_fffffffffffffa18);
        while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18)
              , bVar1) {
          local_2c8 = std::
                      _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                      ::operator*(&local_2a0);
          iVar2 = (*(*local_2c8)->_vptr_statement_base[2])();
          if (iVar2 == 0xb) {
            local_271 = 0;
          }
          else if ((local_271 & 1) == 0) {
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffa20,(value_type *)in_stack_fffffffffffffa18);
          }
          else {
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffa20,(value_type *)in_stack_fffffffffffffa18);
          }
          std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
          operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                      *)in_stack_fffffffffffffa20);
        }
        if ((local_1c8 == (element_type *)0x0) ||
           (iVar2 = (*(code *)(((local_1c8->compiler).
                                super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->constant_pool).
                              super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)(), iVar2 != 7)) {
          psVar6 = (statement_block *)
                   statement_base::operator_new((size_t)in_stack_fffffffffffffa20);
          local_451 = 1;
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffa20,
                     (tree_type<cs::token_base_*> *)in_stack_fffffffffffffa18);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffae0._M_pi,
                     (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffad8);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffae0._M_pi,
                     (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffad8);
          std::shared_ptr<cs::context_type>::shared_ptr
                    ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffa20,
                     (shared_ptr<cs::context_type> *)in_stack_fffffffffffffa18);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffa30);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                    (in_stack_fffffffffffffa30);
          statement_ifelse::statement_ifelse
                    (in_stack_fffffffffffffaa0,
                     (tree_type<cs::token_base_*> *)in_stack_fffffffffffffa98,pdVar4,
                     (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     bfalse.mData,(context_t *)this_00,in_stack_fffffffffffffa78);
          local_451 = 0;
          local_8 = psVar6;
          std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x558762);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffa70);
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                    ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                     in_stack_fffffffffffffa70);
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x558789);
        }
        else {
          token_value::get_value((token_value *)local_1c8);
          pbVar5 = cs_impl::any::const_val<bool>((any *)in_stack_fffffffffffffaa0);
          if ((*pbVar5 & 1U) == 0) {
            psVar6 = (statement_block *)
                     statement_base::operator_new((size_t)in_stack_fffffffffffffa20);
            local_391 = 1;
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffae0._M_pi,
                       (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffad8);
            ptr_00 = local_390;
            std::shared_ptr<cs::context_type>::shared_ptr
                      ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffa20,
                       (shared_ptr<cs::context_type> *)in_stack_fffffffffffffa18);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffffa30);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                      (in_stack_fffffffffffffa30);
            statement_block::statement_block
                      (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,(context_t *)psVar6,
                       ptr_00);
            local_391 = 0;
            local_8 = psVar6;
            std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x55860b)
            ;
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffa70);
          }
          else {
            in_stack_fffffffffffffa70 =
                 (statement_block *)statement_base::operator_new((size_t)in_stack_fffffffffffffa20);
            local_329 = 1;
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffae0._M_pi,
                       (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffad8);
            pdVar4 = &local_328;
            std::shared_ptr<cs::context_type>::shared_ptr
                      ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffa20,
                       (shared_ptr<cs::context_type> *)in_stack_fffffffffffffa18);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffffa30);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                      (in_stack_fffffffffffffa30);
            statement_block::statement_block
                      (in_stack_fffffffffffffa70,pdVar4,(context_t *)in_stack_fffffffffffffa60,
                       in_stack_fffffffffffffa58);
            local_329 = 0;
            local_8 = in_stack_fffffffffffffa70;
            std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x5584f2)
            ;
            std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                      ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                       in_stack_fffffffffffffa70);
          }
        }
        local_330 = 1;
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                   in_stack_fffffffffffffa70);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                   in_stack_fffffffffffffa70);
      }
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffa70);
      return &local_8->super_statement_base;
    }
    local_190 = std::
                _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                ::operator*(&local_168);
    iVar2 = (*(*local_190)->_vptr_statement_base[2])();
    if (iVar2 == 0xb) {
      if ((local_21 & 1) != 0) {
        local_1b2 = 1;
        uVar3 = __cxa_allocate_exception(0x28);
        paVar7 = &local_1b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,"Multi Else Grammar.",paVar7);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18);
        local_1b2 = 0;
        __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_21 = 1;
    }
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                *)in_stack_fffffffffffffa20);
  } while( true );
}

Assistant:

statement_base *method_if::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		bool have_else = false;
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::else_) {
				if (!have_else)
					have_else = true;
				else
					throw compile_error("Multi Else Grammar.");
			}
		}
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (have_else) {
			std::deque<statement_base *> body_true;
			std::deque<statement_base *> body_false;
			bool now_place = true;
			for (auto &ptr: body) {
				if (ptr->get_type() == statement_types::else_) {
					now_place = false;
					continue;
				}
				if (now_place)
					body_true.push_back(ptr);
				else
					body_false.push_back(ptr);
			}
			if (ptr != nullptr && ptr->get_type() == token_types::value) {
				if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
					return new statement_block(body_true, context, raw.front().back());
				else
					return new statement_block(body_false, context, raw.front().back());
			}
			else
				return new statement_ifelse(tree, body_true, body_false, context, raw.front().back());
		}
		else if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_if(tree, body, context, raw.front().back());
	}